

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdout_to_file(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  uv_loop_t *loop;
  char *pcVar6;
  undefined1 local_1f8 [16];
  uv_stdio_container_t stdio [2];
  uv_fs_t fs_req;
  
  unlink("stdout_file");
  init_process_options("spawn_helper2",exit_cb);
  iVar3 = uv_fs_open(0,&fs_req,"stdout_file",0x42,0x180,0);
  if (iVar3 == -1) {
    pcVar6 = "r != -1";
    uVar5 = 0x147;
  }
  else {
    uv_fs_req_cleanup(&fs_req);
    options.stdio = stdio;
    stdio[0].flags = UV_IGNORE;
    options.stdio_count = UV_INHERIT_FD;
    stdio[1].flags = options.stdio_count;
    stdio[1].data._0_4_ = iVar3;
    uVar5 = uv_default_loop();
    iVar4 = uv_spawn(uVar5,&process,&options);
    if (iVar4 == 0) {
      uVar5 = uv_default_loop();
      iVar4 = uv_run(uVar5,0);
      auVar2._8_8_ = local_1f8._8_8_;
      auVar2._0_8_ = local_1f8._0_8_;
      auVar1._8_8_ = local_1f8._8_8_;
      auVar1._0_8_ = local_1f8._0_8_;
      if (iVar4 == 0) {
        if (exit_cb_called == 1) {
          if (close_cb_called == 1) {
            local_1f8 = uv_buf_init(output,0x400);
            iVar4 = uv_fs_read(0,&fs_req,iVar3,local_1f8,1,0,0);
            if (iVar4 == 0xc) {
              uv_fs_req_cleanup(&fs_req);
              iVar3 = uv_fs_close(0,&fs_req,iVar3,0);
              if (iVar3 == 0) {
                uv_fs_req_cleanup(&fs_req);
                printf("output is: %s",output);
                iVar3 = bcmp("hello world\n",output,0xd);
                if (iVar3 == 0) {
                  unlink("stdout_file");
                  loop = (uv_loop_t *)uv_default_loop();
                  close_loop(loop);
                  uVar5 = uv_default_loop();
                  iVar3 = uv_loop_close(uVar5);
                  if (iVar3 == 0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar6 = "0 == uv_loop_close(uv_default_loop())";
                  uVar5 = 0x16a;
                }
                else {
                  pcVar6 = "strcmp(\"hello world\\n\", output) == 0";
                  uVar5 = 0x165;
                }
              }
              else {
                pcVar6 = "r == 0";
                uVar5 = 0x161;
              }
            }
            else {
              pcVar6 = "r == 12";
              uVar5 = 0x15d;
            }
          }
          else {
            pcVar6 = "close_cb_called == 1";
            uVar5 = 0x159;
            local_1f8 = auVar1;
          }
        }
        else {
          pcVar6 = "exit_cb_called == 1";
          uVar5 = 0x158;
          local_1f8 = auVar2;
        }
      }
      else {
        pcVar6 = "r == 0";
        uVar5 = 0x156;
      }
    }
    else {
      pcVar6 = "r == 0";
      uVar5 = 0x153;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c",
          uVar5,pcVar6);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdout_to_file) {
  int r;
  uv_file file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[2];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper2", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);

  file = r;

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = file;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT(r == 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strcmp("hello world\n", output) == 0);

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}